

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitors.c
# Opt level: O1

char * format_mode(GLFWvidmode *mode)

{
  uint a;
  uint b;
  int iVar1;
  undefined4 extraout_var;
  
  a = mode->width;
  b = mode->height;
  iVar1 = euclid(a,b);
  iVar1 = snprintf(format_mode::buffer,0x200,"%i x %i x %i (%i:%i) (%i %i %i) %i Hz",(ulong)a,
                   (ulong)b,(ulong)(uint)(mode->greenBits + mode->redBits + mode->blueBits),
                   (long)(int)a / (long)iVar1 & 0xffffffff,(long)(int)b / (long)iVar1 & 0xffffffff,
                   (ulong)(uint)mode->redBits,(ulong)(uint)mode->greenBits,
                   (ulong)(uint)mode->blueBits,(ulong)(uint)mode->refreshRate);
  format_mode::buffer[0x1ff] = '\0';
  return (char *)CONCAT44(extraout_var,iVar1);
}

Assistant:

static const char* format_mode(const GLFWvidmode* mode)
{
    static char buffer[512];
    const int gcd = euclid(mode->width, mode->height);

    snprintf(buffer,
             sizeof(buffer),
             "%i x %i x %i (%i:%i) (%i %i %i) %i Hz",
             mode->width, mode->height,
             mode->redBits + mode->greenBits + mode->blueBits,
             mode->width / gcd, mode->height / gcd,
             mode->redBits, mode->greenBits, mode->blueBits,
             mode->refreshRate);

    buffer[sizeof(buffer) - 1] = '\0';
    return buffer;
}